

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

void __thiscall bioparser::Parser<biosoup::NucleicAcid>::~Parser(Parser<biosoup::NucleicAcid> *this)

{
  code *pcVar1;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

virtual ~Parser() {}